

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

void __thiscall gl4cts::ClipControlRenderBaseTest::deinit(ClipControlRenderBaseTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  ClipControlRenderBaseTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_ClipControlBaseTest).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x440))(1,&(this->super_ClipControlBaseTest).field_0x7c);
  (**(code **)(lVar3 + 0x460))(1,&this->m_rboC);
  (**(code **)(lVar3 + 0x460))(1,&this->m_rboD);
  (**(code **)(lVar3 + 0x78))(0x8d40,0);
  return;
}

Assistant:

virtual void deinit(void)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		gl.deleteFramebuffers(1, &m_fbo);
		gl.deleteRenderbuffers(1, &m_rboC);
		gl.deleteRenderbuffers(1, &m_rboD);
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	}